

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O1

void CTcMain::S_log_error
               (CTcTokFileDesc *linedesc,long linenum,int *err_counter,int *warn_counter,
               unsigned_long options,int *suppress_list,size_t suppress_cnt,tc_severity_t severity,
               CVmException *exc)

{
  char *msg;
  char msgbuf [1024];
  
  msg = log_msg_internal_1(linedesc,linenum,err_counter,warn_counter,(int *)0x0,(int *)0x0,options,
                           suppress_list,suppress_cnt,severity,exc->error_code_);
  if (msg != (char *)0x0) {
    err_format_msg(msgbuf,0x400,msg,exc);
    format_message(msgbuf,options);
    log_msg_internal_2(options,severity);
  }
  return;
}

Assistant:

void CTcMain::S_log_error(CTcTokFileDesc *linedesc, long linenum,
                          int *err_counter, int *warn_counter,
                          unsigned long options,
                          const int *suppress_list, size_t suppress_cnt,
                          tc_severity_t severity, CVmException *exc)
{
    const char *msg;
    char msgbuf[1024];
    
    /* show the prefix */
    msg = log_msg_internal_1(linedesc, linenum, err_counter, warn_counter,
                             0, 0, options, suppress_list, suppress_cnt,
                             severity, exc->get_error_code());

    /* if the message is suppressed, we're done */
    if (msg == 0)
        return;

    /* format the message using arguments stored in the exception */
    err_format_msg(msgbuf, sizeof(msgbuf), msg, exc);

    /* print the error */
    format_message(msgbuf, options);

    /* show the suffix */
    log_msg_internal_2(options, severity);
}